

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O3

SortableOIDType * __thiscall
SNMPAgent::buildOIDWithPrefix(SNMPAgent *this,char *oid,bool overwritePrefix)

{
  SortableOIDType *this_00;
  string temp;
  allocator local_39;
  string local_38;
  
  if (*(long *)(this + 0xb8) == 0 || overwritePrefix) {
    this_00 = (SortableOIDType *)operator_new(0x68);
    std::__cxx11::string::string((string *)&local_38,oid,&local_39);
    SortableOIDType::SortableOIDType(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_00166c6c;
  }
  else {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_append((char *)&local_38,*(ulong *)(this + 0xb0));
    std::__cxx11::string::append((char *)&local_38);
    this_00 = (SortableOIDType *)operator_new(0x68);
    SortableOIDType::SortableOIDType(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) goto LAB_00166c6c;
  }
  operator_delete(local_38._M_dataplus._M_p);
LAB_00166c6c:
  if ((this_00->super_OIDType).valid == false) {
    (*(this_00->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER[1])(this_00);
    this_00 = (SortableOIDType *)0x0;
  }
  return this_00;
}

Assistant:

SortableOIDType* SNMPAgent::buildOIDWithPrefix(const char *oid, bool overwritePrefix){
    SortableOIDType* newOid;
    if(!this->oidPrefix.empty() && !overwritePrefix){
        std::string temp;
        temp.append(this->oidPrefix);
        temp.append(oid);
        newOid = new SortableOIDType(temp);
    } else {
        newOid = new SortableOIDType(oid);
    }
    if(newOid->valid){
        return newOid;
    }
    delete newOid;
    return nullptr;
}